

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::leaf_node<char,_false>_> * __thiscall
immutable::ref<immutable::rrb_details::leaf_node<char,false>>::operator=
          (ref<immutable::rrb_details::leaf_node<char,false>> *this,
          ref<immutable::rrb_details::internal_node<char,_false>_> *r)

{
  int iVar1;
  internal_node<char,_false> *piVar2;
  void *__ptr;
  
  piVar2 = r->ptr;
  if (piVar2 != (internal_node<char,_false> *)0x0) {
    piVar2->_ref_count = piVar2->_ref_count + 1;
  }
  __ptr = *(void **)this;
  *(internal_node<char,_false> **)this = piVar2;
  if ((__ptr != (void *)0x0) &&
     (iVar1 = *(int *)((long)__ptr + 8), *(int *)((long)__ptr + 8) = iVar1 + -1, iVar1 == 1)) {
    free(__ptr);
  }
  return (ref<immutable::rrb_details::leaf_node<char,_false>_> *)this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }